

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O0

void __thiscall
gmlc::concurrency::
SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
::~SearchableObjectHolder
          (SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this)

{
  bool bVar1;
  int local_34;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  int local_24;
  undefined1 local_20 [4];
  int cntr;
  unique_lock<std::mutex> lock;
  SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mapLock);
  local_24 = 0;
  do {
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::empty(&this->objectMap);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_24 = local_24 + 1;
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
    if (local_24 % 2 == 0) {
      local_34 = 100;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_30,&local_34);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_30);
    }
    else {
      std::this_thread::yield();
    }
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_20);
  } while (local_24 < 7);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map(&this->typeMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~map(&this->objectMap);
  return;
}

Assistant:

~SearchableObjectHolder()
    {
#ifdef ENABLE_TRIPWIRE
        // this is a short circuit used to detect shutdown
        if (trippedDetect.isTripped()) {
            return;
        }
#endif
        std::unique_lock<std::mutex> lock(mapLock);
        int cntr = 0;
        while (!objectMap.empty()) {
            ++cntr;
            lock.unlock();
            // don't leave things locked while sleeping or yielding
            if (cntr % 2 != 0) {
                std::this_thread::yield();
            } else {
                std::this_thread::sleep_for(std::chrono::milliseconds(100));
            }

            lock.lock();
            if (cntr > 6) {
                break;
            }
        }
    }